

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

QString * __thiscall
QtPrivate::QCalendarModel::dayName
          (QString *__return_storage_ptr__,QCalendarModel *this,DayOfWeek day)

{
  HorizontalHeaderFormat HVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  FormatType FVar6;
  long in_FS_OFFSET;
  QLocale QStack_78;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  HVar1 = this->m_horizontalHeaderFormat;
  if (HVar1 == LongDayNames) {
    QWidget::locale((QLocale *)&local_58,(QWidget *)this->m_view);
    FVar6 = (FormatType)&local_58;
LAB_003a4727:
    QLocale::dayName((int)__return_storage_ptr__,FVar6);
    QLocale::~QLocale((QLocale *)&local_58);
  }
  else {
    if (HVar1 == ShortDayNames) {
      QWidget::locale((QLocale *)&local_58,(QWidget *)this->m_view);
      FVar6 = (FormatType)&local_58;
      goto LAB_003a4727;
    }
    if (HVar1 != SingleLetterDayNames) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_003a479e;
    }
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::locale((QLocale *)&local_70,(QWidget *)this->m_view);
    QLocale::standaloneDayName((int)&local_58,(FormatType)&local_70);
    QLocale::~QLocale((QLocale *)&local_70);
    QWidget::locale(&QStack_78,(QWidget *)this->m_view);
    QLocale::dayName((int)&local_70,(FormatType)&QStack_78);
    bVar5 = ::comparesEqual((QString *)&local_58,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QLocale::~QLocale(&QStack_78);
    qVar4 = local_58.size;
    pcVar3 = local_58.ptr;
    pDVar2 = local_58.d;
    if (bVar5) {
      QString::left(__return_storage_ptr__,(QString *)&local_58,1);
    }
    else {
      local_58.d = (Data *)0x0;
      local_58.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = pcVar3;
      local_58.size = 0;
      (__return_storage_ptr__->d).size = qVar4;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_003a479e:
  __stack_chk_fail();
}

Assistant:

QString QCalendarModel::dayName(Qt::DayOfWeek day) const
{
    switch (m_horizontalHeaderFormat) {
        case QCalendarWidget::SingleLetterDayNames: {
            QString standaloneDayName = m_view->locale().standaloneDayName(day, QLocale::NarrowFormat);
            if (standaloneDayName == m_view->locale().dayName(day, QLocale::NarrowFormat))
                return standaloneDayName.left(1);
            return standaloneDayName;
        }
        case QCalendarWidget::ShortDayNames:
            return m_view->locale().dayName(day, QLocale::ShortFormat);
        case QCalendarWidget::LongDayNames:
            return m_view->locale().dayName(day, QLocale::LongFormat);
        default:
            break;
    }
    return QString();
}